

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O1

void Scl_LibPinArrival(SC_Timing *pTime,SC_Pair *pArrIn,SC_Pair *pSlewIn,SC_Pair *pLoad,
                      SC_Pair *pArrOut,SC_Pair *pSlewOut)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  if ((pTime->tsense | sc_ts_Neg) == sc_ts_Non) {
    fVar3 = pArrOut->rise;
    fVar2 = pArrIn->rise;
    fVar1 = Scl_LibLookup(&pTime->pCellRise,pSlewIn->rise,pLoad->rise);
    fVar1 = fVar1 + fVar2;
    if (fVar3 <= fVar1) {
      fVar3 = fVar1;
    }
    pArrOut->rise = fVar3;
    fVar3 = pArrOut->fall;
    fVar2 = pArrIn->fall;
    fVar1 = Scl_LibLookup(&pTime->pCellFall,pSlewIn->fall,pLoad->fall);
    fVar1 = fVar1 + fVar2;
    if (fVar3 <= fVar1) {
      fVar3 = fVar1;
    }
    pArrOut->fall = fVar3;
    fVar3 = pSlewOut->rise;
    fVar2 = Scl_LibLookup(&pTime->pRiseTrans,pSlewIn->rise,pLoad->rise);
    if (fVar3 <= fVar2) {
      fVar3 = fVar2;
    }
    pSlewOut->rise = fVar3;
    fVar3 = pSlewOut->fall;
    fVar2 = Scl_LibLookup(&pTime->pFallTrans,pSlewIn->fall,pLoad->fall);
    if (fVar3 <= fVar2) {
      fVar3 = fVar2;
    }
    pSlewOut->fall = fVar3;
  }
  if ((pTime->tsense & ~sc_ts_Pos) == sc_ts_Neg) {
    fVar3 = pArrOut->rise;
    fVar2 = pArrIn->fall;
    fVar1 = Scl_LibLookup(&pTime->pCellRise,pSlewIn->fall,pLoad->rise);
    fVar1 = fVar1 + fVar2;
    if (fVar3 <= fVar1) {
      fVar3 = fVar1;
    }
    pArrOut->rise = fVar3;
    fVar3 = pArrOut->fall;
    fVar2 = pArrIn->rise;
    fVar1 = Scl_LibLookup(&pTime->pCellFall,pSlewIn->rise,pLoad->fall);
    fVar1 = fVar1 + fVar2;
    if (fVar3 <= fVar1) {
      fVar3 = fVar1;
    }
    pArrOut->fall = fVar3;
    fVar3 = pSlewOut->rise;
    fVar2 = Scl_LibLookup(&pTime->pRiseTrans,pSlewIn->fall,pLoad->rise);
    if (fVar3 <= fVar2) {
      fVar3 = fVar2;
    }
    pSlewOut->rise = fVar3;
    fVar3 = pSlewOut->fall;
    fVar2 = Scl_LibLookup(&pTime->pFallTrans,pSlewIn->rise,pLoad->fall);
    if (fVar3 <= fVar2) {
      fVar3 = fVar2;
    }
    pSlewOut->fall = fVar3;
  }
  return;
}

Assistant:

static inline void Scl_LibPinArrival( SC_Timing * pTime, SC_Pair * pArrIn, SC_Pair * pSlewIn, SC_Pair * pLoad, SC_Pair * pArrOut, SC_Pair * pSlewOut )
{
    if (pTime->tsense == sc_ts_Pos || pTime->tsense == sc_ts_Non)
    {
        pArrOut->rise  = Abc_MaxFloat( pArrOut->rise,  pArrIn->rise + Scl_LibLookup(&pTime->pCellRise,  pSlewIn->rise, pLoad->rise) );
        pArrOut->fall  = Abc_MaxFloat( pArrOut->fall,  pArrIn->fall + Scl_LibLookup(&pTime->pCellFall,  pSlewIn->fall, pLoad->fall) );
        pSlewOut->rise = Abc_MaxFloat( pSlewOut->rise,                Scl_LibLookup(&pTime->pRiseTrans, pSlewIn->rise, pLoad->rise) );
        pSlewOut->fall = Abc_MaxFloat( pSlewOut->fall,                Scl_LibLookup(&pTime->pFallTrans, pSlewIn->fall, pLoad->fall) );
    }
    if (pTime->tsense == sc_ts_Neg || pTime->tsense == sc_ts_Non)
    {
        pArrOut->rise  = Abc_MaxFloat( pArrOut->rise,  pArrIn->fall + Scl_LibLookup(&pTime->pCellRise,  pSlewIn->fall, pLoad->rise) );
        pArrOut->fall  = Abc_MaxFloat( pArrOut->fall,  pArrIn->rise + Scl_LibLookup(&pTime->pCellFall,  pSlewIn->rise, pLoad->fall) );
        pSlewOut->rise = Abc_MaxFloat( pSlewOut->rise,                Scl_LibLookup(&pTime->pRiseTrans, pSlewIn->fall, pLoad->rise) );
        pSlewOut->fall = Abc_MaxFloat( pSlewOut->fall,                Scl_LibLookup(&pTime->pFallTrans, pSlewIn->rise, pLoad->fall) );
    }
}